

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall net_uv::Buffer::add(Buffer *this,char *pData,uint32_t dataLen)

{
  block *pbVar1;
  uint local_44;
  uint32_t copylen;
  uint32_t sub;
  block *b;
  char *curData;
  uint32_t dataLen_local;
  char *pData_local;
  Buffer *this_local;
  
  b = (block *)pData;
  for (curData._4_4_ = dataLen; curData._4_4_ != 0; curData._4_4_ = curData._4_4_ - local_44) {
    if (this->m_blockSize <= this->m_tailBlock->dataLen) {
      pbVar1 = createBlock(this);
      this->m_tailBlock->next = pbVar1;
      pbVar1->pre = this->m_tailBlock;
      this->m_tailBlock = pbVar1;
    }
    local_44 = this->m_blockSize - this->m_tailBlock->dataLen;
    if (curData._4_4_ < local_44) {
      local_44 = curData._4_4_;
    }
    memcpy(this->m_tailBlock->data + this->m_tailBlock->dataLen,b,(ulong)local_44);
    this->m_tailBlock->dataLen = local_44 + this->m_tailBlock->dataLen;
    this->m_curDataLength = local_44 + this->m_curDataLength;
    b = (block *)((long)&b->dataLen + (ulong)local_44);
  }
  return;
}

Assistant:

void add(char* pData, uint32_t dataLen)
	{
		char* curData = pData;
		while (dataLen > 0)
		{
			// create a new node
			if (m_tailBlock->dataLen >= m_blockSize)
			{
				block* b = createBlock();
				m_tailBlock->next = b;
				b->pre = m_tailBlock;
				m_tailBlock = b;
			}
			uint32_t sub = m_blockSize - m_tailBlock->dataLen;
			uint32_t copylen = (sub > dataLen) ? dataLen : sub;

			memcpy(m_tailBlock->data + m_tailBlock->dataLen, curData, copylen);

			m_tailBlock->dataLen += copylen;
			m_curDataLength += copylen;
			curData = curData + copylen;
			dataLen -= copylen;
		}
	}